

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O3

void __thiscall Memory::CacheAllocator::CheckIsAllZero(CacheAllocator *this,bool lockdown)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long *plVar6;
  undefined8 *in_FS_OFFSET;
  DWORD local_40;
  DWORD local_3c;
  DWORD oldProtect;
  DWORD oldProtect_1;
  
  plVar6 = *(long **)(this + 0x20);
  _oldProtect = this;
  if (plVar6 != (long *)0x0) {
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    do {
      lVar5 = plVar6[1];
      if ((lVar5 != 0) &&
         (((char)plVar6[2] != '\0' ||
          ((lVar5 != 1 &&
           (iVar4 = bcmp(plVar6 + 2,(void *)((long)plVar6 + 0x11),lVar5 - 1), iVar4 != 0)))))) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                           ,0x5f1,"(IsAll((byte*)memoryBlock->GetBytes(), memoryBlock->nbytes, 0))",
                           "IsAll((byte*)memoryBlock->GetBytes(), memoryBlock->nbytes, 0)");
        if (!bVar3) goto LAB_001f9523;
        *puVar1 = 0;
      }
      plVar6 = (long *)*plVar6;
    } while (plVar6 != (long *)0x0);
  }
  if (((byte)_oldProtect[0x80] & lockdown) != 0) {
    return;
  }
  plVar6 = *(long **)(_oldProtect + 0x10);
  if (plVar6 != (long *)0x0) {
    lVar5 = (*(long *)(_oldProtect + 0x30) - (long)plVar6) + -0x20;
    if (lVar5 != plVar6[3]) {
      plVar6[3] = lVar5;
      plVar6 = *(long **)(_oldProtect + 0x10);
      if (plVar6 == (long *)0x0) goto LAB_001f943f;
    }
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    do {
      lVar5 = plVar6[3];
      if ((lVar5 != 0) &&
         (((char)plVar6[4] != '\0' ||
          ((lVar5 != 1 &&
           (iVar4 = bcmp(plVar6 + 4,(void *)((long)plVar6 + 0x21),lVar5 - 1), iVar4 != 0)))))) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                           ,0x5fd,"(IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0))",
                           "IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0)");
        if (!bVar3) goto LAB_001f9523;
        *puVar1 = 0;
      }
      if (lockdown) {
        VirtualProtect((long *)plVar6[2] + 2,*(long *)plVar6[2] * 0x1000 - 0x10,2,&local_40);
      }
      plVar6 = (long *)*plVar6;
    } while (plVar6 != (long *)0x0);
  }
LAB_001f943f:
  plVar6 = *(long **)(_oldProtect + 0x18);
  if (plVar6 != (long *)0x0) {
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    do {
      lVar5 = plVar6[3];
      if ((lVar5 != 0) &&
         (((char)plVar6[4] != '\0' ||
          ((lVar5 != 1 &&
           (iVar4 = bcmp(plVar6 + 4,(void *)((long)plVar6 + 0x21),lVar5 - 1), iVar4 != 0)))))) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                           ,0x609,"(IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0))",
                           "IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0)");
        if (!bVar3) {
LAB_001f9523:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar1 = 0;
      }
      if (lockdown) {
        VirtualProtect((long *)plVar6[2] + 2,*(long *)plVar6[2] * 0x1000 - 0x10,2,&local_3c);
      }
      plVar6 = (long *)*plVar6;
    } while (plVar6 != (long *)0x0);
  }
  if (lockdown) {
    _oldProtect[0x80] = (CacheAllocator)0x1;
  }
  return;
}

Assistant:

void CacheAllocator::CheckIsAllZero(bool lockdown)
{
    ArenaMemoryBlock * memoryBlock = this->mallocBlocks;
    while (memoryBlock != nullptr)
    {
        Assert(IsAll((byte*)memoryBlock->GetBytes(), memoryBlock->nbytes, 0));
        memoryBlock = memoryBlock->next;
    }

    if (verifiedAllZeroAndLockedDown && lockdown)
    {
        return;
    }
    UpdateCacheBlock();
    BigBlock *blockp = this->bigBlocks;
    while (blockp != NULL)
    {
        Assert(IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0));
        if (lockdown)
        {
            DWORD oldProtect;
            VirtualProtect(blockp->allocation->GetAddress(), blockp->allocation->GetSize(), PAGE_READONLY, &oldProtect);
        }
        blockp = blockp->nextBigBlock;
    }

    blockp = this->fullBlocks;
    while (blockp != NULL)
    {
        Assert(IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0));
        if (lockdown)
        {
            DWORD oldProtect;
            VirtualProtect(blockp->allocation->GetAddress(), blockp->allocation->GetSize(), PAGE_READONLY, &oldProtect);
        }
        blockp = blockp->nextBigBlock;
    }

    if (lockdown)
    {
        verifiedAllZeroAndLockedDown = true;
    }
}